

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmder_.c
# Opt level: O1

void lmder_(minpack_funcder_mn fcnder_mn,int *m,int *n,double *x,double *fvec,double *fjac,
           int *ldfjac,double *ftol,double *xtol,double *gtol,int *maxfev,double *diag,int *mode,
           double *factor,int *nprint,int *info,int *nfev,int *njev,int *ipvt,double *qtf,
           double *wa1,double *wa2,double *wa3,double *wa4)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 uVar16;
  double dVar17;
  double dVar18;
  int local_12c;
  double *local_128;
  double *local_120;
  double delta;
  minpack_funcder_mn local_110;
  double par;
  ulong local_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  double local_e0;
  double *local_d8;
  int c_true;
  long local_c8;
  ulong local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  long local_60;
  double *local_58;
  int c__1;
  double local_48;
  undefined8 uStack_40;
  
  c__1 = 1;
  c_true = 1;
  local_c0 = (ulong)*ldfjac;
  local_128 = fvec;
  local_120 = fjac;
  local_110 = fcnder_mn;
  dVar13 = dpmpar_(&c__1);
  *info = 0;
  local_12c = 0;
  *nfev = 0;
  *njev = 0;
  uVar2 = *n;
  if ((((0 < (int)uVar2) && ((int)uVar2 <= *m)) && (*m <= *ldfjac)) &&
     (((0.0 < *ftol || *ftol == 0.0 && (0.0 < *xtol || *xtol == 0.0)) &&
      ((0.0 < *gtol || *gtol == 0.0 && ((0 < *maxfev && (0.0 < *factor)))))))) {
    if (*mode == 2) {
      uVar5 = 0;
      do {
        if (diag[uVar5] <= 0.0) goto LAB_0010244c;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    local_12c = 1;
    local_98 = dVar13;
    (*local_110)(m,n,x,local_128,local_120,ldfjac,&local_12c);
    pdVar8 = local_128;
    *nfev = 1;
    if (-1 < local_12c) {
      local_88 = enorm_(m,local_128);
      par = 0.0;
      local_12c = 2;
      uStack_80 = extraout_XMM0_Qb;
      (*local_110)(m,n,x,pdVar8,local_120,ldfjac,&local_12c);
      *njev = *njev + 1;
      if (-1 < local_12c) {
        local_58 = local_120 + ~local_c0;
        local_c8 = local_c0 * 8;
        local_d8 = local_120 + local_c0 + ~local_c0 + 1;
        local_60 = local_c0 * 8 + 8;
        local_100 = 1;
        local_e0 = 0.0;
        do {
          if (0 < *nprint) {
            local_12c = 0;
            if (((int)local_100 + -1) % *nprint == 0) {
              (*local_110)(m,n,x,local_128,local_120,ldfjac,&local_12c);
            }
            if (local_12c < 0) break;
          }
          qrfac_(m,n,local_120,ldfjac,&c_true,ipvt,n,wa1,wa2,wa3);
          uVar5 = local_c0;
          if ((int)local_100 == 1) {
            if ((*mode != 2) && (uVar2 = *n, 0 < (int)uVar2)) {
              uVar6 = 0;
              do {
                diag[uVar6] = wa2[uVar6];
                if ((wa2[uVar6] == 0.0) && (!NAN(wa2[uVar6]))) {
                  diag[uVar6] = 1.0;
                }
                uVar6 = uVar6 + 1;
              } while (uVar2 != uVar6);
            }
            uVar2 = *n;
            if (0 < (int)uVar2) {
              uVar6 = 0;
              do {
                wa3[uVar6] = diag[uVar6] * x[uVar6];
                uVar6 = uVar6 + 1;
              } while (uVar2 != uVar6);
            }
            local_e0 = enorm_(n,wa3);
            delta = local_e0 * *factor;
            if ((delta == 0.0) && (!NAN(delta))) {
              delta = *factor;
            }
          }
          uVar2 = *m;
          if (0 < (long)(int)uVar2) {
            uVar6 = 0;
            do {
              wa4[uVar6] = local_128[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
          }
          uVar3 = *n;
          if (0 < (int)uVar3) {
            uVar6 = (ulong)(uVar2 + 1);
            local_e8 = (double)(long)(int)uVar2;
            lVar9 = 1;
            pdVar8 = wa4;
            pdVar10 = local_d8;
            do {
              uVar6 = uVar6 - 1;
              lVar11 = (long)((int)lVar9 * (int)uVar5);
              dVar13 = local_58[lVar9 + lVar11];
              if ((dVar13 != 0.0) || (NAN(dVar13))) {
                dVar14 = 0.0;
                if (lVar9 <= (long)local_e8) {
                  uVar7 = 0;
                  do {
                    dVar14 = dVar14 + pdVar10[uVar7] * pdVar8[uVar7];
                    uVar7 = uVar7 + 1;
                  } while (uVar6 != uVar7);
                }
                if (lVar9 <= (int)uVar2) {
                  uVar7 = 0;
                  do {
                    pdVar8[uVar7] = pdVar10[uVar7] * (-dVar14 / dVar13) + pdVar8[uVar7];
                    uVar7 = uVar7 + 1;
                  } while (uVar6 != uVar7);
                }
              }
              local_58[lVar9 + lVar11] = wa1[lVar9 + -1];
              qtf[lVar9 + -1] = wa4[lVar9 + -1];
              lVar9 = lVar9 + 1;
              pdVar10 = (double *)((long)pdVar10 + local_60);
              pdVar8 = pdVar8 + 1;
            } while (lVar9 != (ulong)uVar3 + 1);
          }
          local_f8 = 0.0;
          if (0 < (int)uVar3 && local_88 != 0.0) {
            local_f8 = 0.0;
            uVar5 = 1;
            pdVar8 = local_d8;
            do {
              dVar13 = wa2[(long)ipvt[uVar5 - 1] + -1];
              if ((dVar13 != 0.0) || (NAN(dVar13))) {
                dVar14 = 0.0;
                uVar6 = 0;
                do {
                  dVar14 = dVar14 + (qtf[uVar6] / local_88) * pdVar8[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar5 != uVar6);
                uVar6 = -(ulong)(ABS(dVar14 / dVar13) <= local_f8);
                local_f8 = (double)(uVar6 & (ulong)local_f8 | ~uVar6 & (ulong)ABS(dVar14 / dVar13));
              }
              uVar5 = uVar5 + 1;
              pdVar8 = (double *)((long)pdVar8 + local_c8);
            } while (uVar5 != uVar3 + 1);
          }
          uStack_f0 = 0;
          if (local_f8 <= *gtol) {
            *info = 4;
          }
          if (*info != 0) break;
          if ((*mode != 2) && (uVar2 = *n, 0 < (int)uVar2)) {
            uVar5 = 0;
            do {
              uVar6 = -(ulong)(wa2[uVar5] <= diag[uVar5]);
              diag[uVar5] = (double)(~uVar6 & (ulong)wa2[uVar5] | (ulong)diag[uVar5] & uVar6);
              uVar5 = uVar5 + 1;
            } while (uVar2 != uVar5);
          }
          do {
            lmpar_(n,local_120,ldfjac,ipvt,diag,qtf,&delta,&par,wa1,wa2,wa3,wa4);
            uVar2 = *n;
            if (0 < (int)uVar2) {
              uVar5 = 0;
              do {
                dVar13 = wa1[uVar5];
                wa1[uVar5] = -dVar13;
                wa2[uVar5] = x[uVar5] - dVar13;
                wa3[uVar5] = diag[uVar5] * wa1[uVar5];
                uVar5 = uVar5 + 1;
              } while (uVar2 != uVar5);
            }
            local_b8 = enorm_(n,wa3);
            if ((int)local_100 == 1) {
              delta = (double)(~-(ulong)(delta <= local_b8) & (ulong)local_b8 |
                              (ulong)delta & -(ulong)(delta <= local_b8));
            }
            local_12c = 1;
            uStack_b0 = extraout_XMM0_Qb_00;
            (*local_110)(m,n,wa2,wa4,local_120,ldfjac,&local_12c);
            *nfev = *nfev + 1;
            if (local_12c < 0) goto LAB_0010244c;
            local_e8 = enorm_(m,wa4);
            local_78 = local_e8 * 0.1;
            uVar2 = *n;
            if (0 < (int)uVar2) {
              lVar9 = 1;
              pdVar8 = local_d8;
              do {
                wa3[lVar9 + -1] = 0.0;
                dVar13 = wa1[(long)ipvt[lVar9 + -1] + -1];
                lVar11 = 0;
                do {
                  wa3[lVar11] = pdVar8[lVar11] * dVar13 + wa3[lVar11];
                  lVar11 = lVar11 + 1;
                } while (lVar9 != lVar11);
                lVar9 = lVar9 + 1;
                pdVar8 = (double *)((long)pdVar8 + local_c8);
              } while (lVar9 != (ulong)uVar2 + 1);
            }
            dVar13 = enorm_(n,wa3);
            if (par < 0.0) {
              local_a8 = dVar13;
              dVar14 = sqrt(par);
              dVar13 = local_a8;
              uVar16 = extraout_XMM0_Qb_01;
            }
            else {
              dVar14 = SQRT(par);
              uVar16 = 0;
            }
            dVar17 = 1.0 - (local_e8 / local_88) * (local_e8 / local_88);
            dVar12 = (double)-(ulong)(local_78 < local_88);
            dVar1 = (double)(~(ulong)dVar12 & 0xbff0000000000000 | (ulong)dVar12 & (ulong)dVar17);
            dVar15 = (dVar14 * local_b8) / local_88;
            dVar15 = dVar15 * dVar15;
            dVar18 = (dVar13 / local_88) * (dVar13 / local_88);
            dVar14 = dVar15 + dVar15 + dVar18;
            dVar13 = (double)(-(ulong)(dVar14 != 0.0) & (ulong)(dVar1 / dVar14));
            if (dVar13 <= 0.25) {
              dVar18 = dVar18 + dVar15;
              dVar1 = (double)(~-(ulong)(dVar1 < 0.0) & 0x3fe0000000000000 |
                              (ulong)((dVar18 * -0.5) / (dVar1 * 0.5 - dVar18)) &
                              -(ulong)(dVar1 < 0.0));
              dVar15 = 0.1;
              if (local_78 < local_88 && 0.1 <= dVar1) {
                dVar15 = dVar1;
              }
              uVar5 = -(ulong)(delta <= local_b8 / 0.1);
              delta = (double)(uVar5 & (ulong)delta | ~uVar5 & (ulong)(local_b8 / 0.1)) * dVar15;
              par = par / dVar15;
            }
            else if ((0.75 <= dVar13) || ((par == 0.0 && (!NAN(par))))) {
              delta = local_b8 + local_b8;
              par = par * 0.5;
            }
            if (0.0001 <= dVar13) {
              uVar2 = *n;
              if (0 < (int)uVar2) {
                uVar5 = 0;
                do {
                  dVar1 = wa2[uVar5];
                  x[uVar5] = dVar1;
                  wa2[uVar5] = dVar1 * diag[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar2 != uVar5);
              }
              uStack_40 = 0;
              uStack_b0 = 0;
              uVar2 = *m;
              if (0 < (int)uVar2) {
                uVar5 = 0;
                do {
                  local_128[uVar5] = wa4[uVar5];
                  uVar5 = uVar5 + 1;
                } while (uVar2 != uVar5);
              }
              local_b8 = dVar13;
              local_a8 = dVar14;
              uStack_a0 = uVar16;
              local_78 = dVar12;
              local_48 = dVar17;
              local_e0 = enorm_(n,wa2);
              local_100 = (ulong)((int)local_100 + 1);
              local_88 = local_e8;
              uStack_80 = 0;
              dVar13 = local_b8;
              dVar14 = local_a8;
              dVar17 = local_48;
              dVar12 = local_78;
            }
            dVar12 = (double)(~(ulong)dVar12 & 0x3ff0000000000000 |
                             (ulong)ABS(dVar17) & (ulong)dVar12);
            dVar1 = *ftol;
            dVar17 = dVar13 * 0.5;
            if (dVar17 <= 1.0 && (dVar14 <= dVar1 && dVar12 <= dVar1)) {
              *info = 1;
            }
            if (delta <= *xtol * local_e0) {
              *info = 2;
            }
            if ((dVar17 <= 1.0 && (dVar14 <= dVar1 && dVar12 <= dVar1)) && (*info == 2)) {
              *info = 3;
            }
            if (*info != 0) goto LAB_0010244c;
            if ((((delta <= local_98 * local_e0) || (local_f8 <= local_98)) ||
                ((local_98 >= dVar12 && local_98 >= dVar14) && 1.0 >= dVar17)) || (*maxfev <= *nfev)
               ) {
              iVar4 = 6 - (uint)((local_98 < dVar12 || local_98 < dVar14) || 1.0 < dVar17);
              if (delta <= local_98 * local_e0) {
                iVar4 = 7;
              }
              if (local_f8 <= local_98) {
                iVar4 = 8;
              }
              *info = iVar4;
            }
            if (*info != 0) goto LAB_0010244c;
          } while (dVar13 < 0.0001);
          local_12c = 2;
          (*local_110)(m,n,x,local_128,local_120,ldfjac,&local_12c);
          *njev = *njev + 1;
          if (local_12c < 0) break;
        } while( true );
      }
    }
  }
LAB_0010244c:
  if (local_12c < 0) {
    *info = local_12c;
  }
  local_12c = 0;
  if (0 < *nprint) {
    (*local_110)(m,n,x,local_128,local_120,ldfjac,&local_12c);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(lmder)(__minpack_decl_fcnder_mn__ const int *m, const int *n, real *x, 
	real *fvec, real *fjac, const int *ldfjac, const real *ftol,
	const real *xtol, const real *gtol, const int *maxfev, real *
	diag, const int *mode, const real *factor, const int *nprint, int *
	info, int *nfev, int *njev, int *ipvt, real *qtf, 
	real *wa1, real *wa2, real *wa3, real *wa4)
{
    /* Table of constant values */

    const int c__1 = 1;
    const int c_true = TRUE_;

    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p25 ((real).25)
#define p75 .75
#define p0001 1e-4

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;
    real d__1, d__2, d__3;

    /* Local variables */
    int i__, j, l;
    real par, sum;
    int iter;
    real temp, temp1, temp2;
    int iflag;
    real delta;
    real ratio;
    real fnorm, gnorm, pnorm, xnorm = 0, fnorm1, actred, dirder, 
	    epsmch, prered;

/*     ********** */

/*     subroutine lmder */

/*     the purpose of lmder is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine lmder(fcn,m,n,x,fvec,fjac,ldfjac,ftol,xtol,gtol, */
/*                        maxfev,diag,mode,factor,nprint,info,nfev, */
/*                        njev,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,fjac,ldfjac,iflag) */
/*         integer m,n,ldfjac,iflag */
/*         double precision x(n),fvec(m),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmder. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output m by n array. the upper n by n submatrix */
/*         of fjac contains an upper triangular matrix r with */
/*         diagonal elements of nonincreasing magnitude such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower trapezoidal */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.).100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x, fvec, and fjac */
/*         available for printing. fvec and fjac should not be */
/*         altered. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn with iflag = 1 has */
/*                   reached maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular */
/*         with diagonal elements of nonincreasing magnitude. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,lmpar,qrfac */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa4;
    --fvec;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --ipvt;
    --diag;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    *info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (*n <= 0 || *m < *n || *ldfjac < *m || *ftol < 0. || *xtol < 0. || 
	    *gtol < 0. || *maxfev <= 0 || *factor <= 0.) {
	goto L300;
    }
    if (*mode != 2) {
	goto L20;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (diag[j] <= 0.) {
	    goto L300;
	}
/* L10: */
    }
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = 1;
    fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    *nfev = 1;
    if (iflag < 0) {
	goto L300;
    }
    fnorm = __minpack_func__(enorm)(m, &fvec[1]);

/*     initialize levenberg-marquardt parameter and iteration counter. */

    par = 0.;
    iter = 1;

/*     beginning of the outer loop. */

L30:

/*        calculate the jacobian matrix. */

    iflag = 2;
    fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*njev);
    if (iflag < 0) {
	goto L300;
    }

/*        if requested, call fcn to enable printing of iterates. */

    if (*nprint <= 0) {
	goto L40;
    }
    iflag = 0;
    if ((iter - 1) % *nprint == 0) {
	fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    if (iflag < 0) {
	goto L300;
    }
L40:

/*        compute the qr factorization of the jacobian. */

    __minpack_func__(qrfac)(m, n, &fjac[fjac_offset], ldfjac, &c_true, &ipvt[1], n, &wa1[1], &
	    wa2[1], &wa3[1]);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

    if (iter != 1) {
	goto L80;
    }
    if (*mode == 2) {
	goto L60;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	diag[j] = wa2[j];
	if (wa2[j] == 0.) {
	    diag[j] = 1.;
	}
/* L50: */
    }
L60:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = diag[j] * x[j];
/* L70: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa3[1]);
    delta = *factor * xnorm;
    if (delta == 0.) {
	delta = *factor;
    }
L80:

/*        form (q transpose)*fvec and store the first n components in */
/*        qtf. */

    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	wa4[i__] = fvec[i__];
/* L90: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (fjac[j + j * fjac_dim1] == 0.) {
	    goto L120;
	}
	sum = 0.;
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * wa4[i__];
/* L100: */
	}
	temp = -sum / fjac[j + j * fjac_dim1];
	i__2 = *m;
	for (i__ = j; i__ <= i__2; ++i__) {
	    wa4[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L110: */
	}
L120:
	fjac[j + j * fjac_dim1] = wa1[j];
	qtf[j] = wa4[j];
/* L130: */
    }

/*        compute the norm of the scaled gradient. */

    gnorm = 0.;
    if (fnorm == 0.) {
	goto L170;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = ipvt[j];
	if (wa2[l] == 0.) {
	    goto L150;
	}
	sum = 0.;
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * (qtf[i__] / fnorm);
/* L140: */
	}
/* Computing MAX */
	d__2 = gnorm, d__3 = fabs(sum / wa2[l]);
	gnorm = max(d__2,d__3);
L150:
/* L160: */
	;
    }
L170:

/*        test for convergence of the gradient norm. */

    if (gnorm <= *gtol) {
	*info = 4;
    }
    if (*info != 0) {
	goto L300;
    }

/*        rescale if necessary. */

    if (*mode == 2) {
	goto L190;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/* L180: */
    }
L190:

/*        beginning of the inner loop. */

L200:

/*           determine the levenberg-marquardt parameter. */

    __minpack_func__(lmpar)(n, &fjac[fjac_offset], ldfjac, &ipvt[1], &diag[1], &qtf[1], &delta,
	     &par, &wa1[1], &wa2[1], &wa3[1], &wa4[1]);

/*           store the direction p and x + p. calculate the norm of p. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = -wa1[j];
	wa2[j] = x[j] + wa1[j];
	wa3[j] = diag[j] * wa1[j];
/* L210: */
    }
    pnorm = __minpack_func__(enorm)(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

    iflag = 1;
    fcnder_mn(m, n, &wa2[1], &wa4[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*nfev);
    if (iflag < 0) {
	goto L300;
    }
    fnorm1 = __minpack_func__(enorm)(m, &wa4[1]);

/*           compute the scaled actual reduction. */

    actred = -1.;
    if (p1 * fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = 1 - d__1 * d__1;
    }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = 0.;
	l = ipvt[j];
	temp = wa1[l];
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    wa3[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L220: */
	}
/* L230: */
    }
    temp1 = __minpack_func__(enorm)(n, &wa3[1]) / fnorm;
    temp2 = sqrt(par) * pnorm / fnorm;
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    prered = d__1 * d__1 + d__2 * d__2 / p5;
/* Computing 2nd power */
    d__1 = temp1;
/* Computing 2nd power */
    d__2 = temp2;
    dirder = -(d__1 * d__1 + d__2 * d__2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

    ratio = 0.;
    if (prered != 0.) {
	ratio = actred / prered;
    }

/*           update the step bound. */

    if (ratio > p25) {
	goto L240;
    }
    if (actred >= 0.) {
	temp = p5;
    } else {
	temp = p5 * dirder / (dirder + p5 * actred);
    }
    if (p1 * fnorm1 >= fnorm || temp < p1) {
	temp = p1;
    }
/* Computing MIN */
    d__1 = delta, d__2 = pnorm / p1;
    delta = temp * min(d__1,d__2);
    par /= temp;
    goto L260;
L240:
    if (par != 0. && ratio < p75) {
	goto L250;
    }
    delta = pnorm / p5;
    par = p5 * par;
L250:
L260:

/*           test for successful iteration. */

    if (ratio < p0001) {
	goto L290;
    }

/*           successful iteration. update x, fvec, and their norms. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	x[j] = wa2[j];
	wa2[j] = diag[j] * x[j];
/* L270: */
    }
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	fvec[i__] = wa4[i__];
/* L280: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa2[1]);
    fnorm = fnorm1;
    ++iter;
L290:

/*           tests for convergence. */

    if (fabs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= 1.) {
	*info = 1;
    }
    if (delta <= *xtol * xnorm) {
	*info = 2;
    }
    if (fabs(actred) <= *ftol && prered <= *ftol && p5 * ratio <= 1. && *info 
	    == 2) {
	*info = 3;
    }
    if (*info != 0) {
	goto L300;
    }

/*           tests for termination and stringent tolerances. */

    if (*nfev >= *maxfev) {
	*info = 5;
    }
    if (fabs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= 1.) {
	*info = 6;
    }
    if (delta <= epsmch * xnorm) {
	*info = 7;
    }
    if (gnorm <= epsmch) {
	*info = 8;
    }
    if (*info != 0) {
	goto L300;
    }

/*           end of the inner loop. repeat if iteration unsuccessful. */

    if (ratio < p0001) {
	goto L200;
    }

/*        end of the outer loop. */

    goto L30;
L300:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	*info = iflag;
    }
    iflag = 0;
    if (*nprint > 0) {
	fcnder_mn(m, n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    return;

/*     last card of subroutine lmder. */

}